

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::text::render_attributes(text *this,form_context *context)

{
  long lVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  ostream *poVar3;
  undefined8 local_28;
  
  local_28 = in_RAX;
  base_widget::render_attributes
            ((base_widget *)
             ((long)&(this->super_base_html_input)._vptr_base_html_input +
             (long)(this->super_base_html_input)._vptr_base_html_input[-3]),context);
  poVar2 = form_context::out(context);
  if (-1 < *(int *)&(this->super_base_html_input).field_0x78) {
    poVar3 = std::operator<<(poVar2,"size=\"");
    local_28 = CONCAT44(*(undefined4 *)&(this->super_base_html_input).field_0x78,local_28._0_4_);
    impl::details::write_int_to_stream<int>::operator()
              ((write_int_to_stream<int> *)((long)&local_28 + 4),poVar3);
    std::operator<<(poVar3,"\" ");
  }
  lVar1 = *(long *)&(this->super_base_html_input).field_0x58;
  if ((-1 < lVar1) && ((this->super_base_html_input).field_0x60 == '\x01')) {
    poVar3 = std::operator<<(poVar2,"maxlength=\"");
    local_28 = CONCAT44(local_28._4_4_,(int)((ulong)lVar1 >> 0x20));
    impl::details::write_int_to_stream<int>::operator()
              ((write_int_to_stream<int> *)&local_28,poVar3);
    std::operator<<(poVar3,"\" ");
  }
  if (((&(this->super_base_html_input).field_0x1f0)
       [(long)(this->super_base_html_input)._vptr_base_html_input[-3]] & 8) != 0) {
    std::operator<<(poVar2,"readonly=\"readonly\" ");
  }
  return;
}

Assistant:

void text::render_attributes(form_context &context)
{
	base_widget::render_attributes(context);

	std::ostream &output = context.out();
	if(size_ >= 0)
		output << "size=\"" << cint(size_) <<"\" ";
	std::pair<int,int> lm=limits();
	if(lm.second >= 0 && validate_charset()) {
		output << "maxlength=\"" << cint(lm.second) << "\" ";
	}
	if(readonly()) {
		output << "readonly=\"readonly\" ";
	}
}